

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O0

Type dg::vr::Relations::getStrict(Type type)

{
  undefined4 in_EDI;
  Type local_4;
  
  switch(in_EDI) {
  case 2:
  case 3:
    local_4 = SLT;
    break;
  case 4:
  case 5:
    local_4 = ULT;
    break;
  case 6:
  case 7:
    local_4 = SGT;
    break;
  case 8:
  case 9:
    local_4 = UGT;
    break;
  default:
    abort();
  }
  return local_4;
}

Assistant:

Relations::Type Relations::getStrict(Type type) {
    switch (type) {
    case Relations::SLT:
    case Relations::SLE:
        return Relations::SLT;
    case Relations::ULT:
    case Relations::ULE:
        return Relations::ULT;
    case Relations::SGT:
    case Relations::SGE:
        return Relations::SGT;
    case Relations::UGT:
    case Relations::UGE:
        return Relations::UGT;
    default:
        assert(0 && "no strict variant");
        abort();
    }
}